

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmGhsMultiTargetGenerator.cxx
# Opt level: O2

bool __thiscall
cmGhsMultiTargetGenerator::VisitCustomCommand
          (cmGhsMultiTargetGenerator *this,
          set<const_cmSourceFile_*,_std::less<const_cmSourceFile_*>,_std::allocator<const_cmSourceFile_*>_>
          *temp,set<const_cmSourceFile_*,_std::less<const_cmSourceFile_*>,_std::allocator<const_cmSourceFile_*>_>
                *perm,vector<const_cmSourceFile_*,_std::allocator<const_cmSourceFile_*>_> *order,
          cmSourceFile *si)

{
  pointer pbVar1;
  bool bVar2;
  iterator iVar3;
  cmCustomCommand *this_00;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *pvVar4;
  cmLocalGenerator *pcVar5;
  cmSourceFile *si_00;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *di;
  pointer name;
  pair<std::_Rb_tree_iterator<const_cmSourceFile_*>,_bool> pVar6;
  cmSourceFile *local_38;
  
  local_38 = si;
  iVar3 = std::
          _Rb_tree<const_cmSourceFile_*,_const_cmSourceFile_*,_std::_Identity<const_cmSourceFile_*>,_std::less<const_cmSourceFile_*>,_std::allocator<const_cmSourceFile_*>_>
          ::find(&perm->_M_t,&local_38);
  if ((_Rb_tree_header *)iVar3._M_node == &(perm->_M_t)._M_impl.super__Rb_tree_header) {
    pVar6 = std::
            _Rb_tree<cmSourceFile_const*,cmSourceFile_const*,std::_Identity<cmSourceFile_const*>,std::less<cmSourceFile_const*>,std::allocator<cmSourceFile_const*>>
            ::_M_insert_unique<cmSourceFile_const*const&>
                      ((_Rb_tree<cmSourceFile_const*,cmSourceFile_const*,std::_Identity<cmSourceFile_const*>,std::less<cmSourceFile_const*>,std::allocator<cmSourceFile_const*>>
                        *)temp,&local_38);
    if (((undefined1  [16])pVar6 & (undefined1  [16])0x1) == (undefined1  [16])0x0) {
      return true;
    }
    this_00 = cmSourceFile::GetCustomCommand(local_38);
    pvVar4 = cmCustomCommand::GetDepends_abi_cxx11_(this_00);
    pbVar1 = (pvVar4->
             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             )._M_impl.super__Vector_impl_data._M_finish;
    for (name = (pvVar4->
                super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                )._M_impl.super__Vector_impl_data._M_start; name != pbVar1; name = name + 1) {
      pcVar5 = cmGeneratorTarget::GetLocalGenerator(this->GeneratorTarget);
      si_00 = cmMakefile::GetSourceFileWithOutput(pcVar5->Makefile,name);
      if ((si_00 != (cmSourceFile *)0x0) &&
         (bVar2 = VisitCustomCommand(this,temp,perm,order,si_00), bVar2)) {
        return true;
      }
    }
    std::
    _Rb_tree<cmSourceFile_const*,cmSourceFile_const*,std::_Identity<cmSourceFile_const*>,std::less<cmSourceFile_const*>,std::allocator<cmSourceFile_const*>>
    ::_M_insert_unique<cmSourceFile_const*const&>
              ((_Rb_tree<cmSourceFile_const*,cmSourceFile_const*,std::_Identity<cmSourceFile_const*>,std::less<cmSourceFile_const*>,std::allocator<cmSourceFile_const*>>
                *)perm,&local_38);
    std::vector<const_cmSourceFile_*,_std::allocator<const_cmSourceFile_*>_>::push_back
              (order,&local_38);
  }
  return false;
}

Assistant:

bool cmGhsMultiTargetGenerator::VisitCustomCommand(
  std::set<cmSourceFile const*>& temp, std::set<cmSourceFile const*>& perm,
  std::vector<cmSourceFile const*>& order, cmSourceFile const* si)
{
  /* check if permanent mark is set*/
  if (perm.find(si) == perm.end()) {
    /* set temporary mark; check if revisit*/
    if (temp.insert(si).second) {
      for (auto& di : si->GetCustomCommand()->GetDepends()) {
        cmSourceFile const* sf = this->GeneratorTarget->GetLocalGenerator()
                                   ->GetMakefile()
                                   ->GetSourceFileWithOutput(di);
        /* if sf exists then visit */
        if (sf && this->VisitCustomCommand(temp, perm, order, sf)) {
          return true;
        }
      }
      /* mark as complete; insert into beginning of list*/
      perm.insert(si);
      order.push_back(si);
      return false;
    }
    /* revisiting item - not a DAG */
    return true;
  }
  /* already complete */
  return false;
}